

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.h
# Opt level: O2

void __thiscall VW::config::base_option::~base_option(base_option *this)

{
  this->_vptr_base_option = (_func_int **)&PTR__base_option_002b3090;
  std::__cxx11::string::~string((string *)&this->m_short_name);
  std::__cxx11::string::~string((string *)&this->m_help);
  std::__cxx11::string::~string((string *)&this->m_name);
  return;
}

Assistant:

virtual ~base_option() {}